

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseEncoding(State *state)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  iVar9 = iVar3 + 1;
  state->recursion_depth = iVar9;
  state->steps = iVar4 + 1;
  if (0x1ffff < iVar4 || 0xff < iVar3) {
    bVar7 = false;
    goto LAB_0014ad5e;
  }
  bVar8 = ParseName(state);
  if (bVar8) {
    ParseBareFunctionType(state);
    iVar9 = state->recursion_depth;
    bVar7 = true;
    goto LAB_0014ad5e;
  }
  iVar9 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar9 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar9 < 0x100) {
    iVar9 = (state->parse_state).prev_name_idx;
    uVar5 = (state->parse_state).mangled_idx;
    uVar6 = (state->parse_state).out_cur_idx;
    uVar10 = *(uint *)&(state->parse_state).field_0xc;
    bVar8 = ParseOneCharToken(state,'T');
    if (bVar8) {
      bVar8 = ParseCharClass(state,"VTISH");
      if (!bVar8) goto LAB_0014aaf0;
      bVar8 = ParseType(state);
      bVar7 = true;
      if (!bVar8) goto LAB_0014aaf0;
    }
    else {
LAB_0014aaf0:
      pPVar1 = &state->parse_state;
      (state->parse_state).prev_name_idx = iVar9;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar10;
      bVar8 = ParseTwoCharToken(state,"Tc");
      if (bVar8) {
        bVar8 = ParseCallOffset(state);
        if (bVar8) {
          bVar8 = ParseCallOffset(state);
          if (bVar8) {
            bVar8 = ParseEncoding(state);
            bVar7 = true;
            if (bVar8) goto LAB_0014ad56;
          }
        }
      }
      (state->parse_state).prev_name_idx = iVar9;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar10;
      bVar8 = ParseTwoCharToken(state,"GV");
      if (bVar8) {
        bVar8 = ParseName(state);
        bVar7 = true;
        if (bVar8) goto LAB_0014ad56;
      }
      (state->parse_state).prev_name_idx = iVar9;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar10;
      bVar8 = ParseOneCharToken(state,'T');
      if (bVar8) {
        bVar8 = ParseCallOffset(state);
        if (bVar8) {
          bVar8 = ParseEncoding(state);
          bVar7 = true;
          if (bVar8) goto LAB_0014ad56;
        }
      }
      (state->parse_state).prev_name_idx = iVar9;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar10;
      bVar8 = ParseTwoCharToken(state,"TC");
      if (bVar8) {
        bVar8 = ParseType(state);
        if (!bVar8) goto LAB_0014ac38;
        bVar8 = ParseNumber(state,(int *)0x0);
        if (!bVar8) goto LAB_0014ac38;
        bVar8 = ParseOneCharToken(state,'_');
        if (!bVar8) goto LAB_0014ac38;
        puVar2 = &(state->parse_state).field_0xf;
        *puVar2 = *puVar2 & 0x7f;
        bVar8 = ParseType(state);
        if (!bVar8) goto LAB_0014ac38;
        uVar10 = uVar10 & 0x80000000 | *(uint *)&(state->parse_state).field_0xc & 0x7fffffff;
        bVar7 = true;
      }
      else {
LAB_0014ac38:
        (state->parse_state).prev_name_idx = iVar9;
        pPVar1->mangled_idx = uVar5;
        pPVar1->out_cur_idx = uVar6;
        *(uint *)&(state->parse_state).field_0xc = uVar10;
        bVar8 = ParseOneCharToken(state,'T');
        if (bVar8) {
          bVar8 = ParseCharClass(state,"FJ");
          if (bVar8) {
            bVar8 = ParseType(state);
            bVar7 = true;
            if (bVar8) goto LAB_0014ad56;
          }
        }
        (state->parse_state).prev_name_idx = iVar9;
        pPVar1->mangled_idx = uVar5;
        pPVar1->out_cur_idx = uVar6;
        *(uint *)&(state->parse_state).field_0xc = uVar10;
        bVar8 = ParseTwoCharToken(state,"GR");
        if (bVar8) {
          bVar8 = ParseName(state);
          bVar7 = true;
          if (bVar8) goto LAB_0014ad56;
        }
        (state->parse_state).prev_name_idx = iVar9;
        pPVar1->mangled_idx = uVar5;
        pPVar1->out_cur_idx = uVar6;
        *(uint *)&(state->parse_state).field_0xc = uVar10;
        bVar8 = ParseTwoCharToken(state,"GA");
        if (bVar8) {
          bVar8 = ParseEncoding(state);
          bVar7 = true;
          if (bVar8) goto LAB_0014ad56;
        }
        (state->parse_state).prev_name_idx = iVar9;
        pPVar1->mangled_idx = uVar5;
        pPVar1->out_cur_idx = uVar6;
        *(uint *)&(state->parse_state).field_0xc = uVar10;
        bVar8 = ParseOneCharToken(state,'T');
        if (bVar8) {
          bVar8 = ParseCharClass(state,"hv");
          if (bVar8) {
            bVar8 = ParseCallOffset(state);
            if (bVar8) {
              bVar8 = ParseEncoding(state);
              bVar7 = true;
              if (bVar8) goto LAB_0014ad56;
            }
          }
        }
        (state->parse_state).prev_name_idx = iVar9;
        pPVar1->mangled_idx = uVar5;
        pPVar1->out_cur_idx = uVar6;
        bVar7 = false;
      }
      *(uint *)&(state->parse_state).field_0xc = uVar10;
    }
LAB_0014ad56:
    iVar9 = state->recursion_depth + -1;
  }
  else {
    bVar7 = false;
  }
  state->recursion_depth = iVar9;
LAB_0014ad5e:
  state->recursion_depth = iVar9 + -1;
  return bVar7;
}

Assistant:

static bool ParseEncoding(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // Implementing the first two productions together as <name>
  // [<bare-function-type>] avoids exponential blowup of backtracking.
  //
  // Since Optional(...) can't fail, there's no need to copy the state for
  // backtracking.
  if (ParseName(state) && Optional(ParseBareFunctionType(state))) {
    return true;
  }

  if (ParseSpecialName(state)) {
    return true;
  }
  return false;
}